

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall
Nfa::dfs_del_loop(Nfa *this,int now,int *_index,
                 stack<int,_std::deque<int,_std::allocator<int>_>_> *stk,
                 vector<int,_std::allocator<int>_> *dfn,vector<int,_std::allocator<int>_> *low,
                 vector<int,_std::allocator<int>_> *belong)

{
  value_type vVar1;
  int iVar2;
  value_type pFVar3;
  bool bVar4;
  reference pvVar5;
  reference ppFVar6;
  reference pEVar7;
  reference pvVar8;
  int *piVar9;
  reference pvVar10;
  byte local_cd;
  byte local_c5;
  reference local_98;
  int local_84;
  undefined1 auStack_80 [4];
  int u;
  undefined8 local_70;
  Edge i;
  iterator __end1;
  iterator __begin1;
  vector<Edge,_std::allocator<Edge>_> *__range1;
  vector<int,_std::allocator<int>_> *local_38;
  vector<int,_std::allocator<int>_> *low_local;
  vector<int,_std::allocator<int>_> *dfn_local;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *stk_local;
  int *_index_local;
  Nfa *pNStack_10;
  int now_local;
  Nfa *this_local;
  
  vVar1 = *_index;
  local_38 = low;
  low_local = dfn;
  dfn_local = (vector<int,_std::allocator<int>_> *)stk;
  stk_local = (stack<int,_std::deque<int,_std::allocator<int>_>_> *)_index;
  _index_local._4_4_ = now;
  pNStack_10 = this;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](dfn,(long)now);
  *pvVar5 = vVar1;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)_index_local._4_4_);
  *pvVar5 = vVar1;
  *(int *)&(stk_local->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_map =
       *(int *)&(stk_local->c).super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_map + 1;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)dfn_local,
             (value_type *)((long)&_index_local + 4));
  ___range1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->used,(long)_index_local._4_4_);
  std::_Bit_reference::operator=((_Bit_reference *)&__range1,true);
  ppFVar6 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                      (&this->Node,(long)_index_local._4_4_);
  pFVar3 = *ppFVar6;
  __end1 = std::vector<Edge,_std::allocator<Edge>_>::begin(&pFVar3->edge);
  i.v = (Fa_Node *)std::vector<Edge,_std::allocator<Edge>_>::end(&pFVar3->edge);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                                     *)&i.v), bVar4) {
    pEVar7 = __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
             operator*(&__end1);
    local_70 = *(undefined8 *)pEVar7;
    i._0_8_ = pEVar7->v;
    if ((char)local_70 == '\0') {
      ppFVar6 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                          (&this->Node,(long)_index_local._4_4_);
      if (((*ppFVar6)->start & 1U) != 0) {
        ppFVar6 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                            (&this->Node,(long)*(int *)i._0_8_);
        (*ppFVar6)->start = true;
      }
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](low_local,(long)*(int *)i._0_8_);
      if (*pvVar5 == 0) {
        dfs_del_loop(this,*(int *)i._0_8_,(int *)stk_local,
                     (stack<int,_std::deque<int,_std::allocator<int>_>_> *)dfn_local,low_local,
                     local_38,belong);
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (local_38,(long)_index_local._4_4_);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)*(int *)i._0_8_);
        piVar9 = std::min<int>(pvVar5,pvVar8);
        iVar2 = *piVar9;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           (local_38,(long)_index_local._4_4_);
        *pvVar5 = iVar2;
      }
      else {
        _auStack_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (&this->used,(long)*(int *)i._0_8_);
        bVar4 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_80);
        if (bVar4) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (local_38,(long)_index_local._4_4_);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (low_local,(long)*(int *)i._0_8_);
          piVar9 = std::min<int>(pvVar5,pvVar8);
          iVar2 = *piVar9;
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (local_38,(long)_index_local._4_4_);
          *pvVar5 = iVar2;
        }
      }
      ppFVar6 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                          (&this->Node,(long)*(int *)i._0_8_);
      if (((*ppFVar6)->end & 1U) != 0) {
        ppFVar6 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                            (&this->Node,(long)_index_local._4_4_);
        (*ppFVar6)->end = true;
      }
    }
    __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::operator++
              (&__end1);
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](low_local,(long)_index_local._4_4_);
  iVar2 = *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_38,(long)_index_local._4_4_);
  if (iVar2 == *pvVar5) {
    do {
      bVar4 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::empty
                        ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)dfn_local);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        return;
      }
      pvVar10 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                          ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)dfn_local);
      local_84 = *pvVar10;
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
                ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)dfn_local);
      local_98 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used,(long)local_84);
      std::_Bit_reference::operator=(&local_98,false);
      vVar1 = _index_local._4_4_;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](belong,(long)local_84);
      *pvVar5 = vVar1;
      ppFVar6 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                          (&this->Node,(long)_index_local._4_4_);
      local_c5 = 1;
      if (((*ppFVar6)->start & 1U) == 0) {
        ppFVar6 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                            (&this->Node,(long)local_84);
        local_c5 = (*ppFVar6)->start;
      }
      ppFVar6 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                          (&this->Node,(long)_index_local._4_4_);
      (*ppFVar6)->start = (bool)(local_c5 & 1);
      ppFVar6 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                          (&this->Node,(long)_index_local._4_4_);
      local_cd = 1;
      if (((*ppFVar6)->end & 1U) == 0) {
        ppFVar6 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                            (&this->Node,(long)local_84);
        local_cd = (*ppFVar6)->end;
      }
      ppFVar6 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                          (&this->Node,(long)_index_local._4_4_);
      (*ppFVar6)->end = (bool)(local_cd & 1);
    } while (local_84 != _index_local._4_4_);
  }
  return;
}

Assistant:

void
Nfa::dfs_del_loop(int now, int &_index, stack<int> &stk, vector<int> &dfn, vector<int> &low,
                  vector<int> &belong) {
    low[now] = dfn[now] = _index;
    _index++;
    stk.push(now);
    used[now] = true;
    for (auto i:Node[now]->edge) {
        if (i.c != '\0') {
            continue;
        }
        if (Node[now]->start) {
            Node[i.v->n]->start = true;
        }
        //start expand
        if (!dfn[i.v->n]) {
            dfs_del_loop(i.v->n, _index, stk, dfn, low, belong);
            low[now] = min(low[now], low[i.v->n]);
        } else if (used[i.v->n]) {
            low[now] = min(low[now], dfn[i.v->n]);
        }
        if (Node[i.v->n]->end) {
            Node[now]->end = true;
        }
        //end expand
    }
    if (dfn[now] == low[now]) {
        while (!stk.empty()) {
            int u = stk.top();
            stk.pop();
            used[u] = false;
            belong[u] = now;

            Node[now]->start = Node[now]->start || Node[u]->start;
            Node[now]->end = Node[now]->end || Node[u]->end;

            if (u == now) {
                break;
            }
        }
    }
}